

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

void __thiscall MTRand::load(MTRand *this,uint32 *loadArray)

{
  int local_2c;
  uint32 *puStack_28;
  int i;
  uint32 *la;
  uint32 *s;
  uint32 *loadArray_local;
  MTRand *this_local;
  
  local_2c = 0x270;
  puStack_28 = loadArray;
  la = this->state;
  while (local_2c != 0) {
    *la = *puStack_28;
    local_2c = local_2c + -1;
    puStack_28 = puStack_28 + 1;
    la = la + 1;
  }
  this->left = (int)*puStack_28;
  this->pNext = this->state + (0x270 - this->left);
  return;
}

Assistant:

void MTRand::load(uint32 *const loadArray) {
  uint32 *s = state;
  uint32 *la = loadArray;
  int i = N;
  for (; i--; *s++ = *la++) {
  }
  left = *la;
  pNext = &state[N - left];
}